

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O3

void __thiscall LinearScan::AllocateNewLifetimes(LinearScan *this,Instr *instr)

{
  ulong *puVar1;
  Opnd *this_00;
  anon_union_8_3_6c1fdb8e_for_scratch aVar2;
  Lifetime *spilledRange;
  SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *this_01;
  code *pcVar3;
  bool bVar4;
  OpndKind OVar5;
  RegNum RVar6;
  uint32 uVar7;
  uint32 uVar8;
  uint uVar9;
  undefined4 *puVar10;
  RegOpnd *pRVar11;
  RegOpnd *pRVar12;
  Type *ppLVar13;
  
  bVar4 = SkipNumberedInstr(this,instr);
  if (bVar4) {
    return;
  }
  if ((((instr->m_src1 != (Opnd *)0x0) &&
       (OVar5 = IR::Opnd::GetKind(instr->m_src1), OVar5 == OpndKindReg)) &&
      (bVar4 = LowererMD::IsAssign(instr), bVar4)) &&
     ((instr->m_dst != (Opnd *)0x0 &&
      (OVar5 = IR::Opnd::GetKind(instr->m_dst), OVar5 == OpndKindReg)))) {
    this_00 = instr->m_dst;
    OVar5 = IR::Opnd::GetKind(this_00);
    if (OVar5 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar10 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar4) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar10 = 0;
    }
    if (this_00[1]._vptr_Opnd != (_func_int **)0x0) {
      pRVar11 = IR::Opnd::AsRegOpnd(instr->m_src1);
      if ((pRVar11->m_sym == (StackSym *)0x0) ||
         (uVar8 = *(uint32 *)((long)pRVar11->m_sym->scratch + 0x7c),
         uVar7 = IR::Instr::GetNumber(instr), uVar8 == uVar7)) {
        pRVar12 = IR::Opnd::AsRegOpnd(instr->m_dst);
        aVar2 = pRVar12->m_sym->scratch;
        if (aVar2 != (anon_union_8_3_6c1fdb8e_for_scratch)0x0) {
          RVar6 = pRVar11->m_reg;
          BVUnitT<unsigned_long>::AssertRange((uint)RVar6);
          puVar1 = (ulong *)((long)aVar2 + 0x70);
          *puVar1 = *puVar1 | 1L << (RVar6 & (RegXMM15|RegXMM14));
        }
      }
    }
  }
  do {
    while( true ) {
      while( true ) {
        this_01 = this->lifetimeList;
        if ((SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)
            (this_01->super_SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>).
            super_SListNodeBase<Memory::ArenaAllocator>.next == this_01) {
          return;
        }
        ppLVar13 = SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::Head
                             (&this_01->
                               super_SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>);
        uVar9 = (*ppLVar13)->start;
        uVar8 = IR::Instr::GetNumber(instr);
        if (uVar8 < uVar9) {
          return;
        }
        ppLVar13 = SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::Head
                             (&this->lifetimeList->
                               super_SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>);
        spilledRange = *ppLVar13;
        uVar8 = IR::Instr::GetNumber(instr);
        spilledRange->lastAllocationStart = uVar8;
        SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::RemoveHead
                  (&this->lifetimeList->
                    super_SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>,
                   this->lifetimeList->allocator);
        uVar9 = *(uint *)&spilledRange->field_0x9c;
        if ((uVar9 >> 8 & 1) == 0) break;
        SpillLiveRange(this,spilledRange,(Instr *)0x0);
      }
      RVar6 = spilledRange->reg;
      if (RVar6 == RegNOREG) break;
      if (this->currentOpHelperBlock == (OpHelperBlock *)0x0) {
        bVar4 = false;
      }
      else {
        uVar9 = spilledRange->end;
        uVar8 = IR::Instr::GetNumber(this->currentOpHelperBlock->opHelperEndInstr);
        bVar4 = uVar8 < uVar9;
      }
      SpillReg(this,RVar6,bVar4);
      uVar9 = *(uint *)&spilledRange->field_0x9c | 0x80;
      *(short *)&spilledRange->field_0x9c = (short)uVar9;
LAB_0057f5d7:
      if ((uVar9 & 1) == 0) {
        AssignActiveReg(this,spilledRange,RVar6);
      }
    }
    if ((uVar9 & 8) == 0) {
      RVar6 = FindReg(this,spilledRange,(RegOpnd *)0x0,false);
      uVar9 = (uint)*(ushort *)&spilledRange->field_0x9c;
      goto LAB_0057f5d7;
    }
    *(ushort *)&spilledRange->field_0x9c = (ushort)uVar9 | 1;
  } while( true );
}

Assistant:

void
LinearScan::AllocateNewLifetimes(IR::Instr *instr)
{
    if (this->SkipNumberedInstr(instr))
    {
        return;
    }

    // Try to catch:
    //      x = MOV y(r1)
    // where y's lifetime just ended and x's lifetime is starting.
    // If so, set r1 as a preferred register for x, which may allow peeps to remove the MOV
    if (instr->GetSrc1() && instr->GetSrc1()->IsRegOpnd() && LowererMD::IsAssign(instr) && instr->GetDst() && instr->GetDst()->IsRegOpnd() && instr->GetDst()->AsRegOpnd()->m_sym)
    {
        IR::RegOpnd *src = instr->GetSrc1()->AsRegOpnd();
        StackSym *srcSym = src->m_sym;
        // If src is a physReg ref, or src's lifetime ends here.
        if (!srcSym || srcSym->scratch.linearScan.lifetime->end == instr->GetNumber())
        {
            Lifetime *dstLifetime = instr->GetDst()->AsRegOpnd()->m_sym->scratch.linearScan.lifetime;
            if (dstLifetime)
            {
                dstLifetime->regPreference.Set(src->GetReg());
            }
        }
    }

    // Look for starting lifetimes
    while (!this->lifetimeList->Empty() && this->lifetimeList->Head()->start <= instr->GetNumber())
    {
        // We're at the start of a new live range

        Lifetime * newLifetime = this->lifetimeList->Head();
        newLifetime->lastAllocationStart = instr->GetNumber();

        this->lifetimeList->RemoveHead();

        if (newLifetime->dontAllocate)
        {
            // Lifetime spilled before beginning allocation (e.g., a lifetime known to span
            // multiple EH regions.) Do the work of spilling it now without adding it to the list.
            this->SpillLiveRange(newLifetime);
            continue;
        }

        RegNum reg;
        if (newLifetime->reg == RegNOREG)
        {
            if (newLifetime->isDeadStore)
            {
                // No uses, let's not waste a reg.
                newLifetime->isSpilled = true;
                continue;
            }
            reg = this->FindReg(newLifetime, nullptr);
        }
        else
        {
            // This lifetime is already assigned a physical register.  Make
            // sure that register is available by calling SpillReg
            reg = newLifetime->reg;

            // If we're in a helper block, the physical register we're trying to ensure is available might get helper
            // spilled. Don't allow that if this lifetime's end lies beyond the end of the helper block because
            // spill code assumes that this physical register isn't active at the end of the helper block when it tries
            // to restore it. So we'd have to really spill the lifetime then anyway.
            this->SpillReg(reg, IsInHelperBlock() ? (newLifetime->end > currentOpHelperBlock->opHelperEndInstr->GetNumber()) : false);
            newLifetime->cantSpill = true;
        }

        // If we did get a register for this lifetime, add it to the active set.
        if (newLifetime->isSpilled == false)
        {
            this->AssignActiveReg(newLifetime, reg);
        }
    }
}